

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsBroker_impl.hpp
# Opt level: O0

void __thiscall
helics::CommsBroker<helics::ipc::IpcComms,_helics::CoreBroker>::CommsBroker
          (CommsBroker<helics::ipc::IpcComms,_helics::CoreBroker> *this)

{
  unique_ptr<helics::ipc::IpcComms,_std::default_delete<helics::ipc::IpcComms>_> *in_RDI;
  CoreBroker *unaff_retaddr;
  CommsBroker<helics::ipc::IpcComms,_helics::CoreBroker> *in_stack_00000080;
  __integral_type_conflict __i;
  undefined1 __i_00;
  
  __i = 0;
  CoreBroker::CoreBroker(unaff_retaddr,SUB81((ulong)in_RDI >> 0x38,0));
  (in_RDI->_M_t).
  super___uniq_ptr_impl<helics::ipc::IpcComms,_std::default_delete<helics::ipc::IpcComms>_>._M_t.
  super__Tuple_impl<0UL,_helics::ipc::IpcComms_*,_std::default_delete<helics::ipc::IpcComms>_>.
  super__Head_base<0UL,_helics::ipc::IpcComms_*,_false>._M_head_impl =
       (IpcComms *)&PTR__CommsBroker_0095c1a8;
  in_RDI[1]._M_t.
  super___uniq_ptr_impl<helics::ipc::IpcComms,_std::default_delete<helics::ipc::IpcComms>_>._M_t.
  super__Tuple_impl<0UL,_helics::ipc::IpcComms_*,_std::default_delete<helics::ipc::IpcComms>_>.
  super__Head_base<0UL,_helics::ipc::IpcComms_*,_false>._M_head_impl =
       (IpcComms *)&PTR__CommsBroker_0095c300;
  std::atomic<int>::atomic((atomic<int> *)in_RDI,__i);
  __i_00 = (undefined1)((uint)__i >> 0x18);
  std::unique_ptr<helics::ipc::IpcComms,std::default_delete<helics::ipc::IpcComms>>::
  unique_ptr<std::default_delete<helics::ipc::IpcComms>,void>(in_RDI);
  std::atomic<bool>::atomic((atomic<bool> *)in_RDI,(bool)__i_00);
  loadComms(in_stack_00000080);
  return;
}

Assistant:

CommsBroker<COMMS, BrokerT>::CommsBroker() noexcept
{
    static_assert(std::is_base_of<CommsInterface, COMMS>::value,
                  "COMMS object must be a CommsInterface Object");
    static_assert(std::is_base_of<BrokerBase, BrokerT>::value,
                  "Broker must be an object  with a base of BrokerBase");
    loadComms();
}